

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::rc::Texture3D::sample4(Texture3D *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  Vec3 *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float r;
  tcu *local_b8;
  float *local_b0;
  undefined1 local_9c [24];
  float lod;
  float p;
  float mw;
  float mv;
  float mu;
  Vec3 *dFdy;
  Vec3 *dFdx;
  tcu local_60 [4];
  int fragNdx;
  Vec3 dFdy1;
  Vec3 dFdy0;
  Vec3 dFdx1;
  Vec3 dFdx0;
  float texDepth;
  float texHeight;
  float texWidth;
  float lodBias_local;
  Vec3 *packetTexcoords_local;
  Vec4 *output_local;
  Texture3D *this_local;
  
  iVar2 = tcu::Texture3DView::getWidth(&this->m_view);
  iVar3 = tcu::Texture3DView::getHeight(&this->m_view);
  iVar4 = tcu::Texture3DView::getDepth(&this->m_view);
  tcu::operator-((tcu *)(dFdx1.m_data + 1),packetTexcoords + 1,packetTexcoords);
  tcu::operator-((tcu *)(dFdy0.m_data + 1),packetTexcoords + 3,packetTexcoords + 2);
  tcu::operator-((tcu *)(dFdy1.m_data + 1),packetTexcoords + 2,packetTexcoords);
  tcu::operator-(local_60,packetTexcoords + 3,packetTexcoords + 1);
  for (dFdx._4_4_ = 0; (int)dFdx._4_4_ < 4; dFdx._4_4_ = dFdx._4_4_ + 1) {
    if ((dFdx._4_4_ & 2) == 0) {
      pVVar1 = &dFdx1;
    }
    else {
      pVVar1 = &dFdy0;
    }
    local_b0 = pVVar1->m_data + 1;
    dFdy = (Vec3 *)local_b0;
    if ((dFdx._4_4_ & 1) == 0) {
      local_b8 = (tcu *)(dFdy1.m_data + 1);
    }
    else {
      local_b8 = local_60;
    }
    _mv = local_b8;
    fVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_b0);
    fVar5 = de::abs<float>(fVar5);
    fVar6 = tcu::Vector<float,_3>::x((Vector<float,_3> *)_mv);
    fVar6 = de::abs<float>(fVar6);
    mw = de::max<float>(fVar5,fVar6);
    fVar5 = tcu::Vector<float,_3>::y(dFdy);
    fVar5 = de::abs<float>(fVar5);
    fVar6 = tcu::Vector<float,_3>::y((Vector<float,_3> *)_mv);
    fVar6 = de::abs<float>(fVar6);
    p = de::max<float>(fVar5,fVar6);
    fVar5 = tcu::Vector<float,_3>::z(dFdy);
    fVar5 = de::abs<float>(fVar5);
    fVar6 = tcu::Vector<float,_3>::z((Vector<float,_3> *)_mv);
    fVar6 = de::abs<float>(fVar6);
    lod = de::max<float>(fVar5,fVar6);
    fVar5 = de::max<float>(mw * (float)iVar2,p * (float)iVar3);
    local_9c._20_4_ = de::max<float>(fVar5,lod * (float)iVar4);
    local_9c._16_4_ = deFloatLog2((float)local_9c._20_4_);
    local_9c._16_4_ = (float)local_9c._16_4_ + lodBias;
    fVar5 = tcu::Vector<float,_3>::x(packetTexcoords + (int)dFdx._4_4_);
    fVar6 = tcu::Vector<float,_3>::y(packetTexcoords + (int)dFdx._4_4_);
    r = tcu::Vector<float,_3>::z(packetTexcoords + (int)dFdx._4_4_);
    sample((Texture3D *)local_9c,fVar5,fVar6,r,(float)local_9c._16_4_);
    *(undefined8 *)output[(int)dFdx._4_4_].m_data = local_9c._0_8_;
    *(undefined8 *)(output[(int)dFdx._4_4_].m_data + 2) = local_9c._8_8_;
  }
  return;
}

Assistant:

void Texture3D::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();
	const float texDepth  = (float)m_view.getDepth();

	const tcu::Vec3 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec3 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec3 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec3 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec3& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec3& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float mw = de::max(de::abs(dFdx.z()), de::abs(dFdy.z()));
		const float p = de::max(de::max(mu * texWidth, mv * texHeight), mw * texDepth);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}